

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int wally_psbt_input_is_finalized(wally_psbt_input *input,size_t *written)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = -2;
  if ((written != (size_t *)0x0) && (*written = 0, input != (wally_psbt_input *)0x0)) {
    uVar2 = 1;
    if (input->final_scriptsig == (uchar *)0x0) {
      uVar2 = (ulong)(input->final_witness != (wally_tx_witness_stack *)0x0);
    }
    *written = uVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int wally_psbt_input_is_finalized(const struct wally_psbt_input *input,
                                  size_t *written)
{
    if (written)
        *written = 0;
    if (!input || !written)
        return WALLY_EINVAL;
    *written = input->final_scriptsig || input->final_witness ? 1 : 0;
    return WALLY_OK;
}